

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::reconfigure(raft_server *this,ptr<cluster_config> *new_config)

{
  size_t *__x;
  ptr<logger> *ppVar1;
  __node_base *p_Var2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  void *pvVar6;
  _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var7;
  _Hash_node_base *p_Var8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  iterator iVar13;
  undefined4 extraout_var;
  ostream *poVar14;
  uint *puVar15;
  uint uVar16;
  thread tVar17;
  __node_base *p_Var18;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *plVar19;
  __shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *p_Var20;
  char *pcVar21;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *plVar22;
  undefined8 uVar23;
  ptr<srv_config> pVar24;
  ptr<snapshot_sync_ctx> snp_ctx;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_400;
  thread local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  ptr<srv_config> srv_added;
  ptr<peer> p;
  vector<int,_std::allocator<int>_> srvs_removed;
  ptr<cluster_config> cur_config;
  vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  srvs_added;
  __shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> local_350;
  stringstream str_buf2;
  undefined4 uStack_33c;
  undefined1 local_338 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [23];
  stringstream str_buf;
  ostream local_1a8 [376];
  
  get_config((raft_server *)&cur_config);
  ppVar1 = &this->l_;
  peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 != (element_type *)0x0) {
    iVar12 = (*peVar3->_vptr_logger[7])();
    if (3 < iVar12) {
      peVar3 = (ppVar1->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      peVar4 = (new_config->super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&str_buf,
                 "new config log idx %lu, prev log idx %lu, cur config log idx %lu, prev log idx %lu"
                 ,peVar4->log_idx_,peVar4->prev_log_idx_,
                 (cur_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->log_idx_,
                 (cur_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->prev_log_idx_);
      (*peVar3->_vptr_logger[8])
                (peVar3,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"reconfigure",0x28c,&str_buf);
      std::__cxx11::string::~string((string *)&str_buf);
    }
    peVar3 = (ppVar1->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar3 != (element_type *)0x0) {
      iVar12 = (*peVar3->_vptr_logger[7])();
      if (4 < iVar12) {
        peVar3 = (ppVar1->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        peVar4 = (new_config->super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&str_buf,
                   "system is reconfigured to have %zu servers, last config index: %lu, this config index: %lu"
                   ,(peVar4->servers_).
                    super__List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                    ._M_impl._M_node._M_size,peVar4->prev_log_idx_,peVar4->log_idx_);
        (*peVar3->_vptr_logger[8])
                  (peVar3,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"reconfigure",0x291,&str_buf);
        std::__cxx11::string::~string((string *)&str_buf);
      }
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&str_buf);
  cluster_config::get_server
            ((cluster_config *)&str_buf2,
             (int)cur_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr);
  local_3f0._M_id._M_thread = (id)&this->id_;
  if (CONCAT44(uStack_33c,_str_buf2) == 0) {
    pVar24 = cluster_config::get_server
                       ((cluster_config *)&snp_ctx,
                        (int)(new_config->
                             super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>)
                             ._M_ptr);
    local_3e8._12_4_ =
         (undefined4)
         CONCAT71(pVar24.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                  _1_7_,snp_ctx.
                        super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr != (element_type *)0x0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&snp_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    local_3e8._12_4_ = 0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_338);
  srvs_removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  srvs_removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  srvs_removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  srvs_added.
  super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  srvs_added.
  super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  srvs_added.
  super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  plVar22 = &((new_config->super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->servers_;
  local_3e8._M_allocated_capacity = (size_type)&this->peers_;
  tVar17._M_id._M_thread = local_3f0._M_id._M_thread;
  plVar19 = plVar22;
  while (plVar19 = (list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                    *)(plVar19->
                      super__List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                      )._M_impl._M_node.super__List_node_base._M_next, plVar19 != plVar22) {
    _str_buf2 = *(int32 *)(plVar19->
                          super__List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                          )._M_impl._M_node._M_size;
    iVar13 = std::
             _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find((_Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_3e8._M_allocated_capacity,(key_type_conflict *)&str_buf2);
    __x = &(plVar19->
           super__List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
           )._M_impl._M_node._M_size;
    uVar16 = *(uint *)tVar17._M_id._M_thread;
    puVar15 = (uint *)*__x;
    if ((iVar13.
         super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>.
         _M_cur == (__node_type *)0x0) && (uVar16 != *puVar15)) {
      std::
      vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
      ::push_back(&srvs_added,(value_type *)__x);
      uVar16 = *(uint *)tVar17._M_id._M_thread;
      puVar15 = (uint *)*__x;
    }
    if (uVar16 == *puVar15) {
      this->my_priority_ = puVar15[0x13];
      this->steps_to_down_ = 0;
      if (((this->role_)._M_i == follower) && (((this->catching_up_)._M_base._M_i & 1U) != 0)) {
        peVar3 = (ppVar1->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (peVar3 != (element_type *)0x0) {
          iVar12 = (*peVar3->_vptr_logger[7])();
          if (3 < iVar12) {
            peVar3 = (ppVar1->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            ;
            msg_if_given_abi_cxx11_
                      ((string *)&str_buf2,
                       "now this node is the part of cluster, catch-up process is done, clearing the flag"
                      );
            (*peVar3->_vptr_logger[8])
                      (peVar3,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"reconfigure",0x2ac,(string *)&str_buf2);
            std::__cxx11::string::~string((string *)&str_buf2);
            tVar17._M_id._M_thread = local_3f0._M_id._M_thread;
          }
        }
        LOCK();
        (this->catching_up_)._M_base._M_i = false;
        UNLOCK();
        restart_election_timer(this);
      }
    }
  }
  p_Var2 = &(this->peers_)._M_h._M_before_begin;
  p_Var18 = p_Var2;
  while (p_Var18 = p_Var18->_M_nxt, p_Var18 != (__node_base *)0x0) {
    cluster_config::get_server
              ((cluster_config *)&str_buf2,
               (int)(new_config->
                    super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    lVar11 = CONCAT44(uStack_33c,_str_buf2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_338);
    if (lVar11 == 0) {
      std::vector<int,_std::allocator<int>_>::push_back
                (&srvs_removed,(value_type_conflict2 *)(p_Var18 + 1));
    }
  }
  cluster_config::get_server
            ((cluster_config *)&str_buf2,
             (int)(new_config->
                  super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  lVar11 = CONCAT44(uStack_33c,_str_buf2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_338);
  if (lVar11 == 0) {
    std::vector<int,_std::allocator<int>_>::push_back
              (&srvs_removed,(value_type_conflict2 *)local_3f0._M_id._M_thread);
  }
  for (p_Var20 = &(srvs_added.
                   super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>;
      p_Var20 !=
      &(srvs_added.
        super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
       super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>; p_Var20 = p_Var20 + 1) {
    std::__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *)&srv_added,p_Var20);
    snp_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)handle_hb_timeout;
    snp_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_400._M_allocated_capacity = (size_type)this;
    std::function<void(int)>::
    function<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*,std::_Placeholder<1>))(int)>,void>
              ((function<void(int)> *)&str_buf2,
               (_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::_Placeholder<1>))(int)>
                *)&snp_ctx);
    std::
    make_shared<nuraft::peer,std::shared_ptr<nuraft::srv_config>&,nuraft::context&,std::function<void(int)>&,std::shared_ptr<nuraft::logger>&>
              ((shared_ptr<nuraft::srv_config> *)&p,(context *)&srv_added,
               (function<void_(int)> *)
               (this->ctx_)._M_t.
               super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
               super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
               super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl,
               (shared_ptr<nuraft::logger> *)&str_buf2);
    peVar5 = p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar12 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->_vptr_log_store[2])();
    LOCK();
    (peVar5->next_log_idx_).super___atomic_base<unsigned_long>._M_i = CONCAT44(extraout_var,iVar12);
    UNLOCK();
    poVar14 = std::operator<<(local_1a8,"add peer ");
    poVar14 = (ostream *)
              std::ostream::operator<<
                        ((ostream *)poVar14,
                         *(int *)CONCAT44(srv_added.
                                          super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr._4_4_,
                                          (uint)srv_added.
                                                super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr));
    poVar14 = std::operator<<(poVar14,", ");
    poVar14 = std::operator<<(poVar14,(string *)
                                      (CONCAT44(srv_added.
                                                super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr._4_4_,
                                                (uint)srv_added.
                                                                                                            
                                                  super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr) + 8));
    poVar14 = std::operator<<(poVar14,", ");
    pcVar21 = "voting member";
    if (*(char *)(CONCAT44(srv_added.
                           super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           ._4_4_,(uint)srv_added.
                                        super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr) + 0x48) != '\0') {
      pcVar21 = "learner";
    }
    poVar14 = std::operator<<(poVar14,pcVar21);
    std::endl<char,std::char_traits<char>>(poVar14);
    snp_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         CONCAT44(snp_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr._4_4_,
                  *(undefined4 *)
                   CONCAT44(srv_added.
                            super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr._4_4_,
                            (uint)srv_added.
                                  super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr));
    std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)
               &snp_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
    std::
    _Hashtable<int,std::pair<int_const,std::shared_ptr<nuraft::peer>>,std::allocator<std::pair<int_const,std::shared_ptr<nuraft::peer>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<int,std::shared_ptr<nuraft::peer>>>
              ((_Hashtable<int,std::pair<int_const,std::shared_ptr<nuraft::peer>>,std::allocator<std::pair<int_const,std::shared_ptr<nuraft::peer>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_3e8._M_allocated_capacity,(string *)&snp_ctx);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_400._M_allocated_capacity);
    peVar3 = (ppVar1->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar3 != (element_type *)0x0) {
      iVar12 = (*peVar3->_vptr_logger[7])();
      if (3 < iVar12) {
        peVar3 = (ppVar1->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&snp_ctx,"server %d is added to cluster",
                   (ulong)*(uint *)CONCAT44(srv_added.
                                            super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr._4_4_,
                                            (uint)srv_added.
                                                  super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr));
        (*peVar3->_vptr_logger[8])
                  (peVar3,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"reconfigure",0x2d4,(string *)&snp_ctx);
        std::__cxx11::string::~string((string *)&snp_ctx);
      }
    }
    if ((this->role_)._M_i == leader) {
      LOCK();
      ((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      suppress_following_error_)._M_base._M_i = true;
      UNLOCK();
      peVar3 = (ppVar1->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar3 != (element_type *)0x0) {
        iVar12 = (*peVar3->_vptr_logger[7])();
        if (3 < iVar12) {
          peVar3 = (ppVar1->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&snp_ctx,"enable heartbeating for server %d",
                     (ulong)*(uint *)CONCAT44(srv_added.
                                              super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr._4_4_,
                                              (uint)srv_added.
                                                                                                        
                                                  super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr));
          (*peVar3->_vptr_logger[8])
                    (peVar3,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                     ,"reconfigure",0x2d8,(string *)&snp_ctx);
          std::__cxx11::string::~string((string *)&snp_ctx);
        }
      }
      enable_hb_for_peer(this,p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      peVar5 = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if ((peVar5 != (element_type *)0x0) &&
         (((peVar5->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->id_ ==
          (((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->config_).
           super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id_)) {
        LOCK();
        ((p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->next_log_idx_).
        super___atomic_base<unsigned_long>._M_i =
             (peVar5->next_log_idx_).super___atomic_base<unsigned_long>._M_i;
        UNLOCK();
        std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::reset
                  (&(this->srv_to_join_).
                    super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::_Function_base::~_Function_base((_Function_base *)&str_buf2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&srv_added.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  for (puVar15 = (uint *)srvs_removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
      puVar15 !=
      (uint *)srvs_removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish; puVar15 = puVar15 + 1) {
    srv_added.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
         *puVar15;
    if (((uint)srv_added.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         == *(uint *)local_3f0._M_id._M_thread) && (((this->catching_up_)._M_base._M_i & 1U) == 0))
    {
      peVar3 = (ppVar1->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar3 != (element_type *)0x0) {
        iVar12 = (*peVar3->_vptr_logger[7])();
        if (3 < iVar12) {
          peVar3 = (ppVar1->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&str_buf2,
                     "this server (%d) has been removed from the cluster, will step down itself soon. config log idx %lu"
                     ,(ulong)*(uint *)local_3f0._M_id._M_thread,
                     ((new_config->
                      super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                     )->log_idx_);
          (*peVar3->_vptr_logger[8])
                    (peVar3,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                     ,"reconfigure",0x2e9,(string *)&str_buf2);
          std::__cxx11::string::~string((string *)&str_buf2);
        }
      }
      _str_buf2 = this->id_;
      local_338._0_4_ = -1;
      local_330[0]._M_allocated_capacity = (element_type *)0x0;
      cb_func::call(&((this->ctx_)._M_t.
                      super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                      .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->cb_func_,
                    RemovedFromCluster,(Param *)&str_buf2);
      this->steps_to_down_ = 2;
    }
    iVar13 = std::
             _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find((_Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_3e8._M_allocated_capacity,(key_type_conflict *)&srv_added);
    if (iVar13.
        super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>.
        _M_cur == (__node_type *)0x0) {
      peVar3 = (ppVar1->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar3 != (element_type *)0x0) {
        iVar12 = (*peVar3->_vptr_logger[7])();
        if (3 < iVar12) {
          peVar3 = (ppVar1->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&str_buf2,"peer %d cannot be found, no action for removing",
                     (ulong)(uint)srv_added.
                                  super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
          (*peVar3->_vptr_logger[8])
                    (peVar3,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                     ,"reconfigure",0x332,(string *)&str_buf2);
          std::__cxx11::string::~string((string *)&str_buf2);
        }
      }
    }
    else {
      peVar5 = (this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (peVar5 == (element_type *)0x0 || (this->role_)._M_i != leader) {
        if ((peVar5 == (element_type *)0x0) &&
           (peVar3 = (ppVar1->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
           , peVar3 != (element_type *)0x0)) {
          iVar12 = (*peVar3->_vptr_logger[7])();
          if (3 < iVar12) {
            peVar3 = (ppVar1->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            ;
            msg_if_given_abi_cxx11_
                      ((string *)&str_buf2,
                       "srv_to_leave_ is currently empty on config for removing %d",
                       (ulong)(uint)((((((ptr<peer> *)
                                        ((long)iVar13.
                                               super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                                               ._M_cur + 0x10))->
                                       super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)
                                      ._M_ptr)->config_).
                                     super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->id_);
            (*peVar3->_vptr_logger[8])
                      (peVar3,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"reconfigure",0x32b,(string *)&str_buf2);
            std::__cxx11::string::~string((string *)&str_buf2);
          }
        }
        remove_peer_from_peers
                  (this,(ptr<peer> *)
                        ((long)iVar13.
                               super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                               ._M_cur + 0x10));
        poVar14 = std::operator<<(local_1a8,"remove peer ");
        poVar14 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)poVar14,
                             (uint)srv_added.
                                   super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
        std::endl<char,std::char_traits<char>>(poVar14);
      }
      else {
        peVar3 = (ppVar1->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (peVar3 != (element_type *)0x0) {
          iVar12 = (*peVar3->_vptr_logger[7])();
          if (3 < iVar12) {
            peVar3 = (ppVar1->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            ;
            msg_if_given_abi_cxx11_
                      ((string *)&str_buf2,"srv_to_leave_: %d",
                       (ulong)(uint)((((this->srv_to_leave_).
                                       super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr)->config_).
                                     super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->id_);
            (*peVar3->_vptr_logger[8])
                      (peVar3,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"reconfigure",0x319,(string *)&str_buf2);
            std::__cxx11::string::~string((string *)&str_buf2);
          }
        }
        peer::get_snapshot_sync_ctx((peer *)&snp_ctx);
        if (snp_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != (element_type *)0x0) {
          peVar3 = (ppVar1->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          if (peVar3 != (element_type *)0x0) {
            pvVar6 = (snp_ctx.
                      super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->user_snp_ctx_;
            iVar12 = (*peVar3->_vptr_logger[7])();
            if (3 < iVar12) {
              peVar3 = (ppVar1->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
              msg_if_given_abi_cxx11_
                        ((string *)&str_buf2,
                         "srv_to_leave_ has snapshot context %p and user context %p, destroy them",
                         snp_ctx.
                         super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,pvVar6);
              (*peVar3->_vptr_logger[8])
                        (peVar3,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                         ,"reconfigure",799,(string *)&str_buf2);
              std::__cxx11::string::~string((string *)&str_buf2);
            }
          }
          clear_snapshot_sync_ctx
                    (this,(this->srv_to_leave_).
                          super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&snp_ctx.
                    super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
    }
  }
  std::__cxx11::stringbuf::str();
  lVar11 = CONCAT44(local_338._4_4_,local_338._0_4_);
  std::__cxx11::string::~string((string *)&str_buf2);
  if ((lVar11 != 0) &&
     (peVar3 = (ppVar1->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
     peVar3 != (element_type *)0x0)) {
    iVar12 = (*peVar3->_vptr_logger[7])();
    if (3 < iVar12) {
      peVar3 = (ppVar1->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__cxx11::stringbuf::str();
      msg_if_given_abi_cxx11_
                ((string *)&str_buf2,"%s",
                 snp_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      (*peVar3->_vptr_logger[8])
                (peVar3,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"reconfigure",0x337,&str_buf2);
      std::__cxx11::string::~string((string *)&str_buf2);
      std::__cxx11::string::~string((string *)&snp_ctx);
    }
  }
  set_config(this,new_config);
  peVar4 = (this->uncommitted_config_).
           super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar4 != (element_type *)0x0) &&
     (peVar4->log_idx_ ==
      ((new_config->super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
      ->log_idx_)) {
    peVar3 = (ppVar1->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar3 != (element_type *)0x0) {
      iVar12 = (*peVar3->_vptr_logger[7])();
      if (3 < iVar12) {
        peVar3 = (ppVar1->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        peVar4 = (this->uncommitted_config_).
                 super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&str_buf2,"clearing uncommitted config at log %lu, prev %lu",
                   peVar4->log_idx_,peVar4->prev_log_idx_);
        (*peVar3->_vptr_logger[8])
                  (peVar3,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"reconfigure",0x341,&str_buf2);
        std::__cxx11::string::~string((string *)&str_buf2);
      }
    }
    std::__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->uncommitted_config_).
                super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>);
  }
  if (local_3e8._M_local_buf[0xc] != '\0') {
    _str_buf2 = this->id_;
    local_338._0_4_ = -1;
    get_config((raft_server *)&snp_ctx);
    local_330[0]._M_allocated_capacity =
         snp_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    cb_func::call(&((this->ctx_)._M_t.
                    super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                    .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->cb_func_,
                  JoinedCluster,(Param *)&str_buf2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&snp_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&str_buf2);
  plVar19 = &((new_config->super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->servers_;
  uVar23 = plVar19;
  while (p_Var7 = (_Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)(((_List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                        *)&((_Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)uVar23)->_M_buckets)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var7 != (_Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)plVar19) {
    p_Var8 = (p_Var7->_M_before_begin)._M_nxt;
    p_Var18 = p_Var2;
    local_3e8._M_allocated_capacity = (size_type)p_Var7;
    while (p_Var18 = p_Var18->_M_nxt, p_Var18 != (__node_base *)0x0) {
      p_Var20 = *(__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> **)
                 &((_Prime_rehash_policy *)(p_Var18 + 2))->_M_max_load_factor;
      std::mutex::lock((mutex *)&p_Var20[0xd]._M_refcount);
      if (p_Var20->_M_ptr->id_ == *(int *)&p_Var8->_M_nxt) {
        std::__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_350,
                   (__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *)
                   &p_Var7->_M_before_begin);
        std::__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (p_Var20,&local_350);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_350._M_refcount);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&p_Var20[0xd]._M_refcount);
    }
    poVar14 = std::operator<<((ostream *)(local_338 + 8),"peer ");
    uVar23 = local_3e8._M_allocated_capacity;
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar14,*(int *)&p_Var8->_M_nxt);
    poVar14 = std::operator<<(poVar14,", DC ID ");
    poVar14 = (ostream *)
              std::ostream::operator<<((ostream *)poVar14,*(int *)((long)&p_Var8->_M_nxt + 4));
    poVar14 = std::operator<<(poVar14,", ");
    poVar14 = std::operator<<(poVar14,(string *)(p_Var8 + 1));
    poVar14 = std::operator<<(poVar14,", ");
    pcVar21 = "voting member";
    if (*(char *)&p_Var8[9]._M_nxt != '\0') {
      pcVar21 = "learner";
    }
    poVar14 = std::operator<<(poVar14,pcVar21);
    poVar14 = std::operator<<(poVar14,", ");
    poVar14 = (ostream *)
              std::ostream::operator<<((ostream *)poVar14,*(int *)((long)&p_Var8[9]._M_nxt + 4));
    std::endl<char,std::char_traits<char>>(poVar14);
  }
  peVar3 = (ppVar1->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar3 != (element_type *)0x0) {
    iVar12 = (*peVar3->_vptr_logger[7])();
    if (3 < iVar12) {
      peVar3 = (ppVar1->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      peVar4 = (new_config->super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      uVar9 = peVar4->log_idx_;
      uVar10 = peVar4->prev_log_idx_;
      std::__cxx11::stringbuf::str();
      msg_if_given_abi_cxx11_
                ((string *)&snp_ctx,
                 "new configuration: log idx %lu, prev log idx %lu\n%smy id: %d, leader: %d, term: %lu"
                 ,uVar9,uVar10,
                 CONCAT44(srv_added.
                          super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                          _4_4_,(uint)srv_added.
                                      super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr),(ulong)(uint)this->id_,
                 (ulong)(uint)(this->leader_).super___atomic_base<int>._M_i,
                 (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i);
      (*peVar3->_vptr_logger[8])
                (peVar3,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"reconfigure",0x364,&snp_ctx);
      std::__cxx11::string::~string((string *)&snp_ctx);
      std::__cxx11::string::~string((string *)&srv_added);
    }
  }
  update_target_priority(this);
  std::__cxx11::stringstream::~stringstream((stringstream *)&str_buf2);
  std::
  vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  ::~vector(&srvs_added);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&srvs_removed.super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::stringstream::~stringstream((stringstream *)&str_buf);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&cur_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void raft_server::reconfigure(const ptr<cluster_config>& new_config) {
    ptr<cluster_config> cur_config = get_config();
    p_in( "new config log idx %" PRIu64 ", prev log idx %" PRIu64 ", "
          "cur config log idx %" PRIu64 ", prev log idx %" PRIu64,
          new_config->get_log_idx(), new_config->get_prev_log_idx(),
          cur_config->get_log_idx(), cur_config->get_prev_log_idx() );
    p_db( "system is reconfigured to have %zu servers, "
          "last config index: %" PRIu64 ", this config index: %" PRIu64 "",
          new_config->get_servers().size(),
          new_config->get_prev_log_idx(),
          new_config->get_log_idx() );

    std::stringstream str_buf;

    // Compare old and new configs, to check if
    // the configuration change is for adding this node.
    bool invoke_join_cb =
        ( !cur_config->get_server(id_) && new_config->get_server(id_) );

    // we only allow one server to be added or removed at a time
    std::vector<int32> srvs_removed;
    std::vector< ptr<srv_config> > srvs_added;
    std::list< ptr<srv_config> >& new_srvs(new_config->get_servers());
    for ( std::list<ptr<srv_config>>::const_iterator it = new_srvs.begin();
          it != new_srvs.end(); ++it ) {
        peer_itor pit = peers_.find((*it)->get_id());
        if (pit == peers_.end() && id_ != (*it)->get_id()) {
            srvs_added.push_back(*it);
        }
        if (id_ == (*it)->get_id()) {
            my_priority_ = (*it)->get_priority();
            steps_to_down_ = 0;
            if (role_ == srv_role::follower &&
                catching_up_) {
                // If this node is newly added, start election timer
                // without waiting for the next append_entries message.
                p_in("now this node is the part of cluster, "
                     "catch-up process is done, clearing the flag");
                catching_up_ = false;
                restart_election_timer();
            }
        }
    }

    for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
        if (!new_config->get_server(it->first)) {
            srvs_removed.push_back(it->first);
        }
    }

    if (!new_config->get_server(id_)) {
        srvs_removed.push_back(id_);
    }

    // ===== Adding new server =====
    for ( std::vector<ptr<srv_config>>::const_iterator it = srvs_added.begin();
          it != srvs_added.end(); ++it ) {
        ptr<srv_config> srv_added = *it;
        timer_task<int32>::executor exec =
            (timer_task<int32>::executor)
            std::bind( &raft_server::handle_hb_timeout,
                       this,
                       std::placeholders::_1 );
        ptr<peer> p = cs_new< peer,
                              ptr<srv_config>&,
                              context&,
                              timer_task<int32>::executor&,
                              ptr<logger>& >
                            ( srv_added, *ctx_, exec, l_ );
        p->set_next_log_idx(log_store_->next_slot());

        str_buf << "add peer " << srv_added->get_id()
                << ", " << srv_added->get_endpoint()
                << ", " << (srv_added->is_learner() ? "learner" : "voting member")
                << std::endl;

        peers_.insert(std::make_pair(srv_added->get_id(), p));
        p_in("server %d is added to cluster", srv_added->get_id());
        if (role_ == srv_role::leader) {
            // Suppress following RPC error as it is expected.
            p->set_suppress_following_error();
            p_in("enable heartbeating for server %d", srv_added->get_id());
            enable_hb_for_peer(*p);
            if (srv_to_join_ && srv_to_join_->get_id() == p->get_id()) {
                p->set_next_log_idx(srv_to_join_->get_next_log_idx());
                srv_to_join_.reset();
            }
        }
    }

    // ===== Removing server =====
    for ( std::vector<int32>::const_iterator it = srvs_removed.begin();
          it != srvs_removed.end(); ++it ) {
        int32 srv_removed = *it;
        if (srv_removed == id_ && !catching_up_) {
            p_in("this server (%d) has been removed from the cluster, "
                 "will step down itself soon. config log idx %" PRIu64,
                 id_,
                 new_config->get_log_idx());
            // this server is removed from cluster

            // Modified by Jung-Sang Ahn (Oct 25, 2017):
            // Reset cluster config and remove all other peer info.
            // If not, this server will repeatedly request leader
            // election of the cluster that this server doesn't belong
            // to anymore.

            // Modified by Jung-Sang Ahn (Dec 24, 2019):
            // Now we have a persistent flag for election timer,
            // we don't need to append any dummy config log at the end,
            // for the case re-joining this replica to the original cluster.
            //reset_peer_info();

            cb_func::Param param(id_, leader_);
            CbReturnCode rc = ctx_->cb_func_.call( cb_func::RemovedFromCluster,
                                                   &param );
            (void)rc;
            steps_to_down_ = 2;
        }

        peer_itor pit = peers_.find(srv_removed);
        if (pit != peers_.end()) {
            // WARNING:
            //   We should not remove the peer from the list immediately,
            //   due to the issue described below:
            //
            // 0) Let's suppose there are 3 servers: S1, S2, and S3,
            //    where S1 is the leader and S3 is going to leave.
            // 1) Generate a conf log for removing server S3.
            // 2) The conf log is committed by S1 and S2 only.
            // 3) Before delivering the conf log to S3, S1 removes
            //    the S3 peer info from the list.
            // 4) It closes the connection to S3.
            // 5) S3 cannot commit the config (containing removing S3).
            // 6) Callback function for `RemovedFromCluster` will be missing,
            //    but S3 will step down itself after 2 timeout period.
            //
            // To address it, we will remove S3 only after the commit index
            // of the last config is delivered to S3.
            // Also we will have timeout for it. If we fail to deliver the
            // commit index, S3 will be just force removed.
            const ptr<peer>& pp = pit->second;

            if (role_ == srv_role::leader && srv_to_leave_) {
                // If leader, keep the to-be-removed server in peer list
                // until 1) catch-up is done, or 2) timeout.
                p_in("srv_to_leave_: %d", srv_to_leave_->get_id());
                ptr<snapshot_sync_ctx> snp_ctx = srv_to_leave_->get_snapshot_sync_ctx();
                if (snp_ctx) {
                    void* user_ctx = snp_ctx->get_user_snp_ctx();
                    p_in("srv_to_leave_ has snapshot context %p and user context %p, "
                         "destroy them",
                         snp_ctx.get(), user_ctx);
                    clear_snapshot_sync_ctx(*srv_to_leave_);
                }

                // However, if `srv_to_leave_` is NULL,
                // it is replaying old config. We can remove it
                // immediately without setting `srv_to_leave_`.

            } else {
                if (!srv_to_leave_) {
                    p_in("srv_to_leave_ is currently empty "
                         "on config for removing %d",
                         pp->get_id());
                }
                remove_peer_from_peers(pp);

                str_buf << "remove peer " << srv_removed << std::endl;
            }
        } else {
            p_in("peer %d cannot be found, no action for removing", srv_removed);
        }
    }

    if (!str_buf.str().empty()) {
        p_in("%s", str_buf.str().c_str());
    }

    set_config(new_config);

    if ( uncommitted_config_ &&
         uncommitted_config_->get_log_idx() == new_config->get_log_idx() ) {
        // All configs are committed.
        p_in("clearing uncommitted config at log %" PRIu64 ", prev %" PRIu64,
             uncommitted_config_->get_log_idx(),
             uncommitted_config_->get_prev_log_idx());
        uncommitted_config_.reset();
    }

    if (invoke_join_cb) {
        cb_func::Param param(id_, leader_);
        ptr<cluster_config> c_conf = get_config();
        param.ctx = (void*)c_conf.get();
        CbReturnCode rc = ctx_->cb_func_.call(cb_func::JoinedCluster, &param);
        (void)rc;
    }

    std::stringstream str_buf2;
    for (auto& entry: new_config->get_servers()) {
        srv_config* s_conf = entry.get();

        // SHOULD update peer's srv_config.
        for (auto& entry_peer: peers_) {
            peer* pp = entry_peer.second.get();
            std::lock_guard<std::mutex> l(pp->get_lock());
            if (pp->get_id() == s_conf->get_id()) {
                pp->set_config(entry);
            }
        }

        str_buf2 << "peer " << s_conf->get_id()
                 << ", DC ID " << s_conf->get_dc_id()
                 << ", " << s_conf->get_endpoint()
                 << ", " << (s_conf->is_learner() ? "learner" : "voting member")
                 << ", " << s_conf->get_priority()
                 << std::endl;
    }
    p_in("new configuration: log idx %" PRIu64 ", prev log idx %" PRIu64 "\n"
         "%smy id: %d, leader: %d, term: %" PRIu64,
         new_config->get_log_idx(), new_config->get_prev_log_idx(),
         str_buf2.str().c_str(), id_, leader_.load(), state_->get_term());

    update_target_priority();
}